

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sink.cpp
# Opt level: O0

int __thiscall kern::SyslogSink::kern_lvl_to_syslog_lvl(SyslogSink *this,LogLevel level)

{
  LogLevel level_local;
  SyslogSink *this_local;
  int local_4;
  
  switch(level) {
  case Trace:
    local_4 = 7;
    break;
  case Debug:
    local_4 = 7;
    break;
  default:
    local_4 = 5;
    break;
  case Info:
    local_4 = 6;
    break;
  case Warning:
    local_4 = 4;
    break;
  case Error:
    local_4 = 3;
    break;
  case Fatal:
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int SyslogSink::kern_lvl_to_syslog_lvl(LogLevel level) {
        switch(level) {
            case LogLevel::Trace:
                return LOG_DEBUG;
            case LogLevel::Debug:
                return LOG_DEBUG;
            case LogLevel::Info:
                return LOG_INFO;
            case LogLevel::Warning:
                return LOG_WARNING;
            case LogLevel::Error:
                return LOG_ERR;
            case LogLevel::Fatal:
                return LOG_ALERT;
            default:
                return LOG_NOTICE;
        }
    }